

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O0

_HashNode * __thiscall SQTable::GetNodeFromTypeHint(SQTable *this,uint64_t hint,SQObjectPtr *key)

{
  ulong uVar1;
  size_t nodeIdx;
  SQObjectPtr *key_local;
  uint64_t hint_local;
  SQTable *this_local;
  _HashNode *local_8;
  
  uVar1 = hint & 0x1f;
  if (((this->_numofnodes_minus_one < uVar1) ||
      (this->_nodes[uVar1].key.super_SQObject._type != OT_STRING)) ||
     (this->_nodes[uVar1].key.super_SQObject._unVal.pTable != (key->super_SQObject)._unVal.pTable))
  {
    local_8 = (_HashNode *)0x0;
  }
  else {
    local_8 = this->_nodes + uVar1;
  }
  return local_8;
}

Assistant:

inline _HashNode *GetNodeFromTypeHint(uint64_t hint, const SQObjectPtr &key) const {
        size_t nodeIdx = size_t(hint & TBL_CLASS_TYPE_MEMBER_MASK);
        if (nodeIdx > _numofnodes_minus_one)
            assert(!"Node index is out of range");
        else if (!sq_isstring(_nodes[nodeIdx].key))
            assert(!"Node key is not a string");
        else if (_string(_nodes[nodeIdx].key) != _string(key))
            assert(!"Literal key mismatch");
        else
            return _nodes + nodeIdx;
        return nullptr;
    }